

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O0

string * __thiscall
ClassicSudokuVisualizer::createBorderTopStyle_abi_cxx11_
          (string *__return_storage_ptr__,ClassicSudokuVisualizer *this)

{
  uint uVar1;
  string local_80 [32];
  string local_60;
  uint local_3c;
  uint local_38;
  uint i;
  uint iStart;
  allocator local_22;
  undefined1 local_21;
  uint local_20;
  uint local_1c;
  uint h;
  uint size;
  ClassicSudokuVisualizer *this_local;
  string *border_top;
  
  _h = this;
  this_local = (ClassicSudokuVisualizer *)__return_storage_ptr__;
  local_1c = SudokuGitter::getElements(&this->gitter);
  local_20 = 0;
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  for (; local_20 < local_1c; local_20 = uVar1 + local_20) {
    local_3c = local_20 * local_1c;
    local_38 = local_3c;
    for (; local_3c < local_38 + local_1c; local_3c = local_3c + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&local_60,local_3c);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar1 = SudokuGitter::getQuadHeight(&this->gitter);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_80,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string ClassicSudokuVisualizer::createBorderTopStyle() {
    unsigned int size = gitter.getElements();
    unsigned int h = 0;
    std::string border_top = "";
    while (h < size) {
        unsigned int iStart = h * size;
        for (unsigned int i = iStart; i < iStart + size; i++) {
            border_top.append("#cell-");
            border_top.append(std::to_string(i));
            border_top.append(", ");
        }
        h += gitter.getQuadHeight();
    }
    border_top = border_top.substr(0, border_top.length() - 2);
    border_top.append(" { border-top: 2px solid #000; } ");
    return border_top;
}